

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::IsUSDFileFormat(string *name)

{
  int iVar1;
  bool bVar2;
  string ext;
  string local_28;
  
  GetExtension(&local_28,name);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
      bVar2 = iVar1 == 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool IsUSDFileFormat(const std::string &name) {
  std::string ext = GetExtension(name);

  // no 'usdz'
  return (ext.compare("usd") == 0) || (ext.compare("usda") == 0) ||
         (ext.compare("usdc") == 0);
}